

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_11fb896::HandleRepeatCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pbVar1;
  size_type sVar2;
  bool bVar3;
  uint uVar4;
  string_view value;
  unsigned_long times;
  string result;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this = status->Makefile;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x80) {
    bVar3 = cmStrToULong(pbVar1 + 2,&times);
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      sVar2 = pbVar1[1]._M_string_length;
      result._M_dataplus._M_p = (pointer)&result.field_2;
      result._M_string_length = 0;
      result.field_2._M_local_buf[0] = '\0';
      if (sVar2 != 0) {
        if (sVar2 == 1) {
          local_48[0] = local_38;
          std::__cxx11::string::_M_construct((ulong)local_48,(char)times);
          std::__cxx11::string::operator=((string *)&result,(string *)local_48);
          std::__cxx11::string::~string((string *)local_48);
        }
        else {
          local_48[0] = local_38;
          std::__cxx11::string::_M_construct((ulong)local_48,(char)times * (char)sVar2);
          std::__cxx11::string::operator=((string *)&result,(string *)local_48);
          std::__cxx11::string::~string((string *)local_48);
          for (uVar4 = 0; uVar4 < times; uVar4 = uVar4 + 1) {
            if (pbVar1[1]._M_string_length != 0) {
              memmove(result._M_dataplus._M_p + sVar2 * uVar4,pbVar1[1]._M_dataplus._M_p,
                      pbVar1[1]._M_string_length);
            }
          }
        }
      }
      value._M_str = result._M_dataplus._M_p;
      value._M_len = result._M_string_length;
      cmMakefile::AddDefinition(this,pbVar1 + 3,value);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"repeat count is not a positive number.",
                 (allocator<char> *)local_48);
      cmMakefile::IssueMessage(this,FATAL_ERROR,&result);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"sub-command REPEAT requires three arguments.",
               (allocator<char> *)local_48);
    cmMakefile::IssueMessage(this,FATAL_ERROR,&result);
  }
  std::__cxx11::string::~string((string *)&result);
  return true;
}

Assistant:

bool HandleRepeatCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  cmMakefile& makefile = status.GetMakefile();

  // `string(REPEAT "<str>" <times> OUTPUT_VARIABLE)`
  enum ArgPos : std::size_t
  {
    SUB_COMMAND,
    VALUE,
    TIMES,
    OUTPUT_VARIABLE,
    TOTAL_ARGS
  };

  if (args.size() != ArgPos::TOTAL_ARGS) {
    makefile.IssueMessage(MessageType::FATAL_ERROR,
                          "sub-command REPEAT requires three arguments.");
    return true;
  }

  unsigned long times;
  if (!cmStrToULong(args[ArgPos::TIMES], &times)) {
    makefile.IssueMessage(MessageType::FATAL_ERROR,
                          "repeat count is not a positive number.");
    return true;
  }

  const auto& stringValue = args[ArgPos::VALUE];
  const auto& variableName = args[ArgPos::OUTPUT_VARIABLE];
  const auto inStringLength = stringValue.size();

  std::string result;
  switch (inStringLength) {
    case 0u:
      // Nothing to do for zero length input strings
      break;
    case 1u:
      // NOTE If the string to repeat consists of the only character,
      // use the appropriate constructor.
      result = std::string(times, stringValue[0]);
      break;
    default:
      result = std::string(inStringLength * times, char{});
      for (auto i = 0u; i < times; ++i) {
        std::copy(cm::cbegin(stringValue), cm::cend(stringValue),
                  &result[i * inStringLength]);
      }
      break;
  }

  makefile.AddDefinition(variableName, result);
  return true;
}